

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext_p.h
# Opt level: O2

QOpenGLContext *
QEGLPlatformContext::createFrom<QXcbEglContext>
          (EGLContext context,EGLDisplay contextDisplay,EGLDisplay platformDisplay,
          QOpenGLContext *shareContext)

{
  QPlatformOpenGLContext *pQVar1;
  QOpenGLContext *this;
  QXcbEglContext *this_00;
  long in_FS_OFFSET;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (context == (EGLContext)0x0) {
    this = (QOpenGLContext *)0x0;
  }
  else if (contextDisplay == platformDisplay) {
    if (shareContext != (QOpenGLContext *)0x0) {
      QOpenGLContext::handle();
    }
    this = (QOpenGLContext *)operator_new(0x10);
    QOpenGLContext::QOpenGLContext(this,(QObject *)0x0);
    pQVar1 = *(QPlatformOpenGLContext **)(this + 8);
    this_00 = (QXcbEglContext *)operator_new(0x78);
    QXcbEglContext::QXcbEglContext(this_00);
    ::QEGLPlatformContext::adopt(this_00,context,(QPlatformOpenGLContext *)contextDisplay);
    QOpenGLContextPrivate::adopt(pQVar1);
  }
  else {
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_40 = "default";
    this = (QOpenGLContext *)0x0;
    QMessageLogger::warning
              (local_58,"QEGLPlatformContext: Cannot adopt context from different display");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

static QOpenGLContext *createFrom(EGLContext context, EGLDisplay contextDisplay,
            EGLDisplay platformDisplay, QOpenGLContext *shareContext)
    {
        if (!context)
            return nullptr;

        // A context belonging to a given EGLDisplay cannot be used with another one
        if (contextDisplay != platformDisplay) {
            qWarning("QEGLPlatformContext: Cannot adopt context from different display");
            return nullptr;
        }

        QPlatformOpenGLContext *shareHandle = shareContext ? shareContext->handle() : nullptr;

        auto *resultingContext = new QOpenGLContext;
        auto *contextPrivate = QOpenGLContextPrivate::get(resultingContext);
        auto *platformContext = new T;
        platformContext->adopt(context, contextDisplay, shareHandle);
        contextPrivate->adopt(platformContext);
        return resultingContext;
    }